

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cpu.h
# Opt level: O0

Features Corrade::Cpu::runtimeFeatures(void)

{
  uint uVar1;
  uint in_XCR0;
  unsigned_long_long xgetbv;
  uint d;
  uint a;
  uint out;
  anon_union_16_2_fc6c903e cpuid;
  
  memset(&a,0,0x10);
  Implementation::cpuid((int *)&a,1,0);
  d = (uint)((cpuid.e.bx & 0x4000000) != 0);
  if ((cpuid.e.ax & 1) != 0) {
    d = d | 2;
  }
  if ((cpuid.e.ax & 0x200) != 0) {
    d = d | 4;
  }
  if ((cpuid.e.ax & 0x80000) != 0) {
    d = d | 8;
  }
  if ((cpuid.e.ax & 0x100000) != 0) {
    d = d | 0x10;
  }
  if ((cpuid.e.ax & 0x800000) != 0) {
    d = d | 0x10000;
  }
  if (((cpuid.e.ax & 0x8000000) != 0) && ((cpuid.e.ax & 0x10000000) != 0)) {
    if ((in_XCR0 & 6) == 6) {
      uVar1 = d | 0x20;
      if ((cpuid.e.ax & 0x20000000) != 0) {
        uVar1 = d | 0x100020;
      }
      d = uVar1;
      if ((cpuid.e.ax & 0x1000) != 0) {
        d = d | 0x200000;
      }
      Implementation::cpuid((int *)&a,7,0);
      if ((out & 8) != 0) {
        d = d | 0x40000;
      }
      if ((out & 0x20) != 0) {
        d = d | 0x40;
      }
      if ((out & 0x100) != 0) {
        d = d | 0x80000;
      }
    }
    if (((out & 0x10000) != 0) && ((in_XCR0 & 0xe6) == 0xe6)) {
      d = d | 0x80;
    }
  }
  Implementation::cpuid((int *)&a,-0x7fffffff,0);
  if ((cpuid.e.ax & 0x20) != 0) {
    d = d | 0x20000;
  }
  Features::Features((Features *)&cpuid.e.cx,d);
  return (Features)cpuid.e.cx;
}

Assistant:

inline Features runtimeFeatures() {
    union {
        struct {
            unsigned int ax, bx, cx, dx;
        } e;
        int data[4];
    } cpuid{};

    Implementation::cpuid(cpuid.data, 1, 0);

    /* https://en.wikipedia.org/wiki/CPUID#EAX=1:_Processor_Info_and_Feature_Bits */
    unsigned int out = 0;
    if(cpuid.e.dx & (1 << 26)) out |= TypeTraits<Sse2T>::Index;
    if(cpuid.e.cx & (1 <<  0)) out |= TypeTraits<Sse3T>::Index;
    if(cpuid.e.cx & (1 <<  9)) out |= TypeTraits<Ssse3T>::Index;
    if(cpuid.e.cx & (1 << 19)) out |= TypeTraits<Sse41T>::Index;
    if(cpuid.e.cx & (1 << 20)) out |= TypeTraits<Sse42T>::Index;

    /* https://en.wikipedia.org/wiki/CPUID#EAX=80000001h:_Extended_Processor_Info_and_Feature_Bits,
       bit 5 says "ABM (lzcnt and popcnt)", but
       https://en.wikipedia.org/wiki/X86_Bit_manipulation_instruction_set#ABM_(Advanced_Bit_Manipulation)
       says that while LZCNT is advertised in the ABM CPUID bit, POPCNT is a
       separate CPUID flag. Get POPCNT first, ABM later. */
    if(cpuid.e.cx & (1 << 23)) out |= TypeTraits<PopcntT>::Index;

    /* AVX needs OS support checked, as the OS needs to be capable of saving
       and restoring the expanded registers when switching contexts:
       https://en.wikipedia.org/wiki/Advanced_Vector_Extensions#Operating_system_support */
    if((cpuid.e.cx & (1 << 27)) && /* XSAVE/XRESTORE CPU support */
       (cpuid.e.cx & (1 << 28)))   /* AVX CPU support */
    {
        /* XGETBV indicates that the registers will be properly saved and
           restored by the OS: https://stackoverflow.com/a/22521619. */

        /* https://github.com/vectorclass/version2/blob/ff7450acfad9d3a7c6825d92cfb782a42ccfa71f/instrset_detect.cpp#L30-L32
           Clang-cl as well, as it doesn't seem to know the MSVC intrinsics. */
        #if defined(CORRADE_TARGET_GCC) || defined(CORRADE_TARGET_CLANG_CL)
        unsigned int a, d;
        __asm("xgetbv": "=a"(a), "=d"(d): "c"(0): );
        const unsigned long long xgetbv = a|(static_cast<unsigned long long>(d) << 32);

        /* Declared at the top of the file */
        #elif defined(CORRADE_TARGET_MSVC)
        const unsigned long long xgetbv = _xgetbv(0);
        #else
        #error
        #endif

        /* If AVX is not supported, we don't check any following flags either */
        if((xgetbv & 0x06) == 0x06 /* XSTATE_SSE|XSTATE_YMM */) {
            out |= TypeTraits<AvxT>::Index;

            if(cpuid.e.cx & (1 << 29)) out |= TypeTraits<AvxF16cT>::Index;
            if(cpuid.e.cx & (1 << 12)) out |= TypeTraits<AvxFmaT>::Index;

            /* https://en.wikipedia.org/wiki/CPUID#EAX=7,_ECX=0:_Extended_Features */
            Implementation::cpuid(cpuid.data, 7, 0);
            if(cpuid.e.bx & (1 << 3)) out |= TypeTraits<Bmi1T>::Index;
            if(cpuid.e.bx & (1 << 5)) out |= TypeTraits<Avx2T>::Index;
            if(cpuid.e.bx & (1 << 8)) out |= TypeTraits<Bmi2T>::Index;
        }

        /* AVX-512 needs additional state saving support
            https://patchwork.ozlabs.org/project/gcc/patch/20180329124309.GA12667@intel.com/#1884915
            https://github.com/google/highway/blob/master/hwy/targets.cc#L279 */
        if((cpuid.e.bx & (1 << 16)) &&
           /* XSTATE_SSE|XSTATE_YMM|XSTATE_OPMASK|XSTATE_ZMM|XSTATE_HI_ZMM */
           (xgetbv & 0xe6) == 0xe6)
        {
            out |= TypeTraits<Avx512fT>::Index;
        }
    }

    /* And now the LZCNT bit, finally
       https://en.wikipedia.org/wiki/CPUID#EAX=80000001h:_Extended_Processor_Info_and_Feature_Bits */
    Implementation::cpuid(cpuid.data, 0x80000001, 0);
    if(cpuid.e.cx & (1 << 5)) out |= TypeTraits<LzcntT>::Index;

    return Features{out};
}